

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

QVariant * operator-(QVariant *__return_storage_ptr__,QVariant *arg1,QVariant *arg2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  long in_FS_OFFSET;
  double dVar6;
  double dVar7;
  QDateTime dt;
  QDateTime a2;
  QDateTime a1;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  iVar1 = QVariant::typeId(arg1);
  iVar2 = QVariant::typeId(arg2);
  if (iVar1 != iVar2) {
    operator-();
  }
  iVar1 = QVariant::typeId(arg1);
  if (iVar1 == 0x10) {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    uVar3 = QDateTime::daysTo((QDateTime *)&local_68);
    uVar4 = QDateTime::secsTo((QDateTime *)&local_68);
    local_58._0_4_ = QDateTime::time();
    iVar1 = QTime::msec();
    uVar5 = QDateTime::time();
    local_70 = (undefined1 *)CONCAT44(local_70._4_4_,uVar5);
    iVar2 = QTime::msec();
    if ((int)(uVar4 | uVar3) < 0) {
      QVariant::operator=(__return_storage_ptr__,arg1);
    }
    else {
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::addDays((longlong)&local_58);
      QDateTime::addSecs((longlong)&local_70);
      QDateTime::~QDateTime((QDateTime *)local_58.data);
      if (0 < iVar1 - iVar2) {
        local_58._0_4_ = QDateTime::time();
        uVar5 = QTime::addMSecs((int)&local_58);
        QDateTime::setTime(&local_70,uVar5,1);
      }
      QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_70);
      QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      QDateTime::~QDateTime((QDateTime *)&local_70);
    }
    QDateTime::~QDateTime((QDateTime *)&local_68);
    QDateTime::~QDateTime((QDateTime *)&local_60);
  }
  else {
    if (iVar1 == 6) {
      dVar6 = (double)QVariant::toDouble((bool *)arg1);
      dVar7 = (double)QVariant::toDouble((bool *)arg2);
      QVariant::QVariant((QVariant *)&local_58,dVar6 - dVar7);
    }
    else {
      if (iVar1 != 2) goto LAB_0047c2ec;
      iVar1 = QVariant::toInt((bool *)arg1);
      iVar2 = QVariant::toInt((bool *)arg2);
      QVariant::QVariant((QVariant *)&local_58,iVar1 - iVar2);
    }
    QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
  }
LAB_0047c2ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant operator-(const QVariant &arg1, const QVariant &arg2)
{
    QVariant ret;
    if (Q_UNLIKELY(arg1.userType() != arg2.userType()))
        qWarning("QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",
                 arg1.typeName(), arg2.typeName(), __FILE__, __LINE__);
    switch (arg1.userType()) {
    case QMetaType::Int: ret = QVariant(arg1.toInt() - arg2.toInt()); break;
    case QMetaType::Double: ret = QVariant(arg1.toDouble() - arg2.toDouble()); break;
    case QMetaType::QDateTime: {
        QDateTime a1 = arg1.toDateTime();
        QDateTime a2 = arg2.toDateTime();
        int days = a2.daysTo(a1);
        int secs = a2.secsTo(a1);
        int msecs = qMax(0, a1.time().msec() - a2.time().msec());
        if (days < 0 || secs < 0 || msecs < 0) {
            ret = arg1;
        } else {
            QDateTime dt = a2.addDays(days).addSecs(secs);
            if (msecs > 0)
                dt.setTime(dt.time().addMSecs(msecs));
            ret = QVariant(dt);
        }
        break;
    }
    default: break;
    }
    return ret;
}